

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_array_union.hh
# Opt level: O0

void avro::codec_traits<uau::r1>::decode(Decoder *d,r1 *v)

{
  bool bVar1;
  Decoder *d_00;
  reference puVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  long in_RDI;
  const_iterator it;
  vector<unsigned_long,_std::allocator<unsigned_long>_> fo;
  ResolvingDecoder *rd;
  _union_array_union_Union__1__ *in_stack_ffffffffffffff98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_38 [4];
  Decoder *__x;
  
  if (in_RDI == 0) {
    d_00 = (Decoder *)0x0;
  }
  else {
    d_00 = (Decoder *)__dynamic_cast(in_RDI,&Decoder::typeinfo,&ResolvingDecoder::typeinfo,0);
  }
  if (d_00 == (Decoder *)0x0) {
    decode<uau::_union_array_union_Union__1__>((Decoder *)0x0,in_stack_ffffffffffffff98);
  }
  else {
    __x = d_00;
    (*(code *)(*(unsigned_long **)d_00)[0x17])();
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (in_RSI,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)__x);
    local_38[0]._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_ffffffffffffff98);
    while( true ) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff98)
      ;
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)d_00,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)in_stack_ffffffffffffff98);
      if (!bVar1) break;
      puVar2 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(local_38);
      if (*puVar2 == 0) {
        decode<uau::_union_array_union_Union__1__>(d_00,in_stack_ffffffffffffff98);
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(local_38);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

static void decode(Decoder& d, uau::r1& v) {
        if (avro::ResolvingDecoder *rd =
            dynamic_cast<avro::ResolvingDecoder *>(&d)) {
            const std::vector<size_t> fo = rd->fieldOrder();
            for (std::vector<size_t>::const_iterator it = fo.begin();
                it != fo.end(); ++it) {
                switch (*it) {
                case 0:
                    avro::decode(d, v.f1);
                    break;
                default:
                    break;
                }
            }
        } else {
            avro::decode(d, v.f1);
        }
    }